

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator_mri.c
# Opt level: O0

int ff(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  sunrealtype w;
  sunrealtype ep;
  sunrealtype b;
  sunrealtype *rdata;
  void *user_data_local;
  N_Vector ydot_local;
  N_Vector y_local;
  sunrealtype t_local;
  
  dVar1 = *(double *)((long)user_data + 8);
  dVar2 = *(double *)((long)user_data + 0x10);
  dVar3 = *(double *)(*(long *)((long)y->content + 0x10) + 0x10);
  **(undefined8 **)((long)ydot->content + 0x10) = 0;
  *(undefined8 *)(*(long *)((long)ydot->content + 0x10) + 8) = 0;
  *(double *)(*(long *)((long)ydot->content + 0x10) + 0x10) = (dVar1 - dVar3) / dVar2;
  return 0;
}

Assistant:

static int ff(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  sunrealtype* rdata = (sunrealtype*)user_data; /* cast user_data to sunrealtype */
  sunrealtype b  = rdata[1];                    /* access data entries */
  sunrealtype ep = rdata[2];
  sunrealtype w  = NV_Ith_S(y, 2); /* access solution values */

  /* fill in the RHS function */
  NV_Ith_S(ydot, 0) = 0.0;
  NV_Ith_S(ydot, 1) = 0.0;
  NV_Ith_S(ydot, 2) = (b - w) / ep;

  /* Return with success */
  return 0;
}